

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

Type __thiscall embree::SceneGraph::PlyParser::parseType(PlyParser *this,stringstream *cin)

{
  bool bVar1;
  Tag TVar2;
  Tag TVar3;
  ulong uVar4;
  ulong uVar5;
  Type TVar6;
  string ty;
  string ty1;
  string ty0;
  
  ty._M_dataplus._M_p = (pointer)&ty.field_2;
  ty._M_string_length = 0;
  ty.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)cin,(string *)&ty);
  bVar1 = std::operator==(&ty,"list");
  if (bVar1) {
    ty0._M_dataplus._M_p = (pointer)&ty0.field_2;
    ty0._M_string_length = 0;
    ty0.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)cin,(string *)&ty0);
    ty1._M_dataplus._M_p = (pointer)&ty1.field_2;
    ty1._M_string_length = 0;
    ty1.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)cin,(string *)&ty1);
    TVar2 = typeTagOfString(&ty0);
    TVar3 = typeTagOfString(&ty1);
    std::__cxx11::string::~string((string *)&ty1);
    std::__cxx11::string::~string((string *)&ty0);
    uVar4 = (ulong)TVar2 << 0x20;
    uVar5 = 8;
  }
  else {
    TVar3 = typeTagOfString(&ty);
    uVar5 = (ulong)TVar3;
    uVar4 = 0x900000000;
    TVar3 = PTY_NONE;
  }
  std::__cxx11::string::~string((string *)&ty);
  TVar6._0_8_ = uVar5 | uVar4;
  TVar6.data = TVar3;
  return TVar6;
}

Assistant:

Type parseType(std::stringstream& cin) 
      {
        std::string ty; cin >> ty;
        if (ty == "list") {
          std::string ty0; cin >> ty0;
          std::string ty1; cin >> ty1;
          return Type(Type::PTY_LIST,typeTagOfString(ty0),typeTagOfString(ty1));
        } else return Type(typeTagOfString(ty));
      }